

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# trees.cpp
# Opt level: O3

void __thiscall IZDeflate::copy_block(IZDeflate *this,char *block,uint len,int header)

{
  uint *o_idx;
  ulong __n;
  uint uVar1;
  size_t __n_00;
  
  __n_00 = (size_t)len;
  bi_windup(this);
  if (header != 0) {
    uVar1 = this->out_offset;
    if (this->out_size - 1 <= uVar1) {
      flush_outbuf(this->out_buf,&this->out_offset);
      uVar1 = this->out_offset;
    }
    this->out_offset = uVar1 + 1;
    this->out_buf[uVar1] = (char)len;
    uVar1 = this->out_offset;
    this->out_offset = uVar1 + 1;
    this->out_buf[uVar1] = (char)(len >> 8);
    uVar1 = this->out_offset;
    if (this->out_size - 1 <= uVar1) {
      flush_outbuf(this->out_buf,&this->out_offset);
      uVar1 = this->out_offset;
    }
    this->out_offset = uVar1 + 1;
    this->out_buf[uVar1] = (char)(len ^ 0xffff);
    uVar1 = this->out_offset;
    this->out_offset = uVar1 + 1;
    this->out_buf[uVar1] = (char)((len ^ 0xffff) >> 8);
  }
  if (this->flush_flg == 0) {
    if (this->out_size < this->out_offset + len) {
      error("output buffer too small for in-memory compression");
      return;
    }
    memcpy(this->out_buf + this->out_offset,block,__n_00);
    this->out_offset = this->out_offset + len;
  }
  else {
    o_idx = &this->out_offset;
    flush_outbuf(this->out_buf,o_idx);
    if (this->key == (char *)0x0) {
      *o_idx = len;
      flush_outbuf(block,o_idx);
      return;
    }
    if (len != 0) {
      do {
        __n = (ulong)this->out_size;
        if ((uint)__n_00 < this->out_size) {
          __n = __n_00;
        }
        this->out_offset = (uint)__n;
        memcpy(this->out_buf,block,__n);
        uVar1 = this->out_offset;
        block = block + uVar1;
        flush_outbuf(this->out_buf,o_idx);
        uVar1 = (uint)__n_00 - uVar1;
        __n_00 = (size_t)uVar1;
      } while (uVar1 != 0);
    }
  }
  return;
}

Assistant:

void IZDeflate::copy_block(char *block, unsigned len, int header)
    // char *block;  /* the input data */
    // unsigned len; /* its length */
    // int header;   /* true if block header must be written */
{
    bi_windup();              /* align on byte boundary */

    if (header) {
        PUTSHORT((ush)len);
        PUTSHORT((ush)~len);
#ifdef DEBUG
        bits_sent += 2*16;
#endif
    }
    if (flush_flg) {
        flush_outbuf(out_buf, &out_offset);
        if (key != (char *)NULL) {  /* key is the global password pointer */
            /* Encryption modifies the data in the output buffer. But the
             * copied input data must remain intact for further deflate
             * string matching lookups.  Therefore, the input data is
             * copied into the compression output buffer for flushing
             * to the compressed/encrypted output stream.
             */
            while(len > 0) {
                out_offset = (len < out_size ? len : out_size);
                memcpy(out_buf, block, out_offset);
                block += out_offset;
                len -= out_offset;
                flush_outbuf(out_buf, &out_offset);
            }
        } else {
            /* Without encryption, the output routines do not touch the
             * written data, so there is no need for an additional copy
             * operation.
             */
            out_offset = len;
            flush_outbuf(block, &out_offset);
        }
    } else if (out_offset + len > out_size) {
        error("output buffer too small for in-memory compression");
    } else {
        memcpy(out_buf + out_offset, block, len);
        out_offset += len;
    }
#ifdef DEBUG
    bits_sent += (ulg)len<<3;
#endif
}